

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void duckdb::roaring::RoaringFetchRow
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  ContainerScanState *pCVar1;
  RoaringScanState scan_state;
  
  RoaringScanState::RoaringScanState(&scan_state,segment);
  pCVar1 = RoaringScanState::LoadContainer
                     (&scan_state,(ulong)row_id >> 0xb,(ulong)((uint)row_id & 0x7ff));
  (*pCVar1->_vptr_ContainerScanState[2])(pCVar1,result,result_idx,1);
  RoaringScanState::~RoaringScanState(&scan_state);
  return;
}

Assistant:

void RoaringFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	RoaringScanState scan_state(segment);

	idx_t internal_offset;
	idx_t container_idx = scan_state.GetContainerIndex(static_cast<idx_t>(row_id), internal_offset);
	auto &container_state = scan_state.LoadContainer(container_idx, internal_offset);

	scan_state.ScanInternal(container_state, 1, result, result_idx);
}